

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layers_switch_Dyy_unconditional_opt_order(fasthessian *fh)

{
  uint uVar1;
  integral_image *iimage;
  ulong uVar2;
  
  iimage = fh->iimage;
  if (iimage->height == 0x20) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[0],iimage);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[1],iimage);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[2],iimage);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[3],iimage);
    height_greater_border_width_greater_double_lobe_Dyy_inlined(fh->response_map[4],iimage);
    height_greater_border_width_less_double_lobe_Dyy_inlined(fh->response_map[5],iimage);
    image_32_filter_75_case(fh->response_map[6],iimage);
    image_32_filter_99_case(fh->response_map[7],iimage);
    return;
  }
  if (iimage->height == 0x40) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[0],iimage);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[1],iimage);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[2],iimage);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[3],iimage);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[4],iimage);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (fh->response_map[5],iimage);
    height_greater_border_width_greater_double_lobe_Dyy_inlined(fh->response_map[6],iimage);
    height_greater_border_width_less_double_lobe_Dyy_inlined(fh->response_map[7],iimage);
    return;
  }
  uVar1 = fh->total_layers;
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
                (fh->response_map[uVar2],iimage);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

void compute_response_layers_switch_Dyy_unconditional_opt_order(struct fasthessian *fh) {
    /*
        base function: compute_response_layer_switch_Dyy_unconditional_opt

        optimization:
        - hardcoded order for image sizes

        notes:
        - intended to check if our corner case optimizations are more optimal or not
        - optimize if statement for a better order, very similar to
            compute_response_layer_switch_Dyy_unconditional_opt_naive,
            just all cases are hardcoded
    */
    int i = 0;
    int n = fh->total_layers;

    struct response_layer *layer;
    struct integral_image *iimage = fh->iimage;

    int image_size = iimage->height;

    if (image_size == 32) {

        // filter 9, 15, 21, 27
        layer = fh->response_map[0];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[1];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[2];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[3];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        // filter 39
        layer = fh->response_map[4];
        height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);

        // filter 51
        layer = fh->response_map[5];
        height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);

        // filter 75
        layer = fh->response_map[6];
        image_32_filter_75_case(layer, iimage);

        // filter 99
        layer = fh->response_map[7];
        image_32_filter_99_case(layer, iimage);

    } else if (image_size == 64) {

        // filter 9, 15, 21, 27, 39, 51
        layer = fh->response_map[0];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[1];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[2];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[3];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[4];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[5];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        // filter 75
        layer = fh->response_map[6];
        height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);

        // filter 99
        layer = fh->response_map[7];
        height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);

    } else {

        // all other cases
        for (; i < n; ++i) {
            layer = fh->response_map[i];

            compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);
        }
    }

}